

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_1a9d::DataTransform<short,_sptk::int24_t>::Run
          (DataTransform<short,_sptk::int24_t> *this,istream *input_stream)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  istream *in_RSI;
  long in_RDI;
  bool bVar5;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  ostringstream error_message;
  bool is_clipped;
  int24_t output_data;
  invalid_argument *anon_var_0;
  string word;
  short input_data;
  int index;
  char buffer [128];
  undefined4 in_stack_fffffffffffffce8;
  byte in_stack_fffffffffffffcec;
  undefined1 in_stack_fffffffffffffced;
  byte in_stack_fffffffffffffcee;
  undefined1 in_stack_fffffffffffffcef;
  allocator *in_stack_fffffffffffffcf0;
  ostream *in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined6 in_stack_fffffffffffffd08;
  undefined2 in_stack_fffffffffffffd0e;
  int in_stack_fffffffffffffd10;
  int in_stack_fffffffffffffd14;
  int24_t *in_stack_fffffffffffffd18;
  int24_t local_288;
  int24_t local_284;
  allocator local_281;
  string local_280 [32];
  ostringstream local_260 [312];
  ostringstream *in_stack_fffffffffffffed8;
  string *in_stack_fffffffffffffee0;
  int24_t local_e2;
  int24_t local_df;
  byte local_dc;
  int24_t local_db [3];
  uint local_d0;
  string local_c0 [34];
  short local_9e;
  int local_9c;
  char local_98 [128];
  istream *local_18;
  byte local_1;
  
  local_9c = 0;
  local_18 = in_RSI;
  do {
    if ((*(byte *)(in_RDI + 0x35) & 1) == 0) {
      bVar5 = sptk::ReadStream<short>
                        ((short *)in_stack_fffffffffffffcf8,(istream *)in_stack_fffffffffffffcf0);
      if (!bVar5) goto LAB_0013141c;
    }
    else {
      std::__cxx11::string::string(local_c0);
      std::operator>>(local_18,local_c0);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::stold((string *)in_stack_fffffffffffffcf0,
                            (size_t *)
                            CONCAT17(in_stack_fffffffffffffcef,
                                     CONCAT16(in_stack_fffffffffffffcee,
                                              CONCAT15(in_stack_fffffffffffffced,
                                                       CONCAT14(in_stack_fffffffffffffcec,
                                                                in_stack_fffffffffffffce8)))));
        local_9e = (short)ROUND(in_ST0);
        local_d0 = 0;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      else {
        local_d0 = 2;
      }
      std::__cxx11::string::~string(local_c0);
      if (local_d0 != 0) {
        if (local_d0 != 1) {
LAB_0013141c:
          if (((*(byte *)(in_RDI + 0x36) & 1) != 0) && (local_9c % *(int *)(in_RDI + 0x28) != 0)) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          local_1 = 1;
        }
LAB_00131458:
        return (bool)(local_1 & 1);
      }
    }
    sptk::int24_t::int24_t<short>
              ((int24_t *)in_stack_fffffffffffffcf0,
               CONCAT11(in_stack_fffffffffffffcef,in_stack_fffffffffffffcee));
    local_dc = 0;
    iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
    iVar2 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
    if (iVar1 < iVar2) {
      if (*(int *)(in_RDI + 0x2c) == 1) {
        lVar4 = (long)local_9e;
        iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
        if (lVar4 < iVar1) {
          sptk::int24_t::operator=(local_db,(int24_t *)(in_RDI + 0x37));
          local_dc = 1;
        }
        else {
          iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
          if ((long)iVar1 < (long)local_9e) {
            sptk::int24_t::operator=(local_db,(int24_t *)(in_RDI + 0x3a));
            local_dc = 1;
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 2) {
        in_stack_fffffffffffffd18 = (int24_t *)(long)local_9e;
        iVar1 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
        if (in_stack_fffffffffffffd18 < (int24_t *)(long)iVar1) {
          sptk::int24_t::operator=(local_db,(int24_t *)(in_RDI + 0x37));
          local_dc = 1;
        }
        else {
          in_stack_fffffffffffffd14 =
               sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
          if ((ulong)(long)in_stack_fffffffffffffd14 < (ulong)(long)local_9e) {
            sptk::int24_t::operator=(local_db,(int24_t *)(in_RDI + 0x3a));
            local_dc = 1;
          }
        }
      }
      else if (*(int *)(in_RDI + 0x2c) == 3) {
        in_stack_fffffffffffffd04 = SUB104((longdouble)local_9e,0);
        in_stack_fffffffffffffd08 = (undefined6)((unkuint10)(longdouble)local_9e >> 0x20);
        in_stack_fffffffffffffd10 = sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x37));
        if ((longdouble)in_stack_fffffffffffffd10 <=
            (longdouble)CONCAT64(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04)) {
          in_stack_fffffffffffffd00 =
               sptk::int24_t::operator_cast_to_int((int24_t *)(in_RDI + 0x3a));
          in_ST6 = in_ST5;
          in_ST7 = in_ST5;
          if ((longdouble)in_stack_fffffffffffffd00 < (longdouble)local_9e) {
            sptk::int24_t::operator=(local_db,(int24_t *)(in_RDI + 0x3a));
            local_dc = 1;
          }
        }
        else {
          in_ST6 = in_ST5;
          in_ST7 = in_ST5;
          sptk::int24_t::operator=(local_db,(int24_t *)(in_RDI + 0x37));
          local_dc = 1;
        }
      }
    }
    if (((*(byte *)(in_RDI + 0x34) & 1) != 0) && ((local_dc & 1) == 0)) {
      if ((double)(int)local_9e <= 0.0) {
        sptk::int24_t::int24_t<double>
                  ((int24_t *)in_stack_fffffffffffffcf0,
                   (double)CONCAT17(in_stack_fffffffffffffcef,
                                    CONCAT16(in_stack_fffffffffffffcee,
                                             CONCAT15(in_stack_fffffffffffffced,
                                                      CONCAT14(in_stack_fffffffffffffcec,
                                                               in_stack_fffffffffffffce8)))));
        sptk::int24_t::operator=(local_db,&local_e2);
        sptk::int24_t::~int24_t(&local_e2);
      }
      else {
        sptk::int24_t::int24_t<double>
                  ((int24_t *)in_stack_fffffffffffffcf0,
                   (double)CONCAT17(in_stack_fffffffffffffcef,
                                    CONCAT16(in_stack_fffffffffffffcee,
                                             CONCAT15(in_stack_fffffffffffffced,
                                                      CONCAT14(in_stack_fffffffffffffcec,
                                                               in_stack_fffffffffffffce8)))));
        sptk::int24_t::operator=(local_db,&local_df);
        sptk::int24_t::~int24_t(&local_df);
      }
    }
    if (((local_dc & 1) == 0) || (*(int *)(in_RDI + 0x30) == 0)) {
LAB_00131224:
      if ((*(byte *)(in_RDI + 0x36) & 1) == 0) {
        local_288.value[2] = local_db[0].value[2];
        local_288.value[0] = local_db[0].value[0];
        local_288.value[1] = local_db[0].value[1];
        in_stack_fffffffffffffced =
             sptk::WriteStream<sptk::int24_t>
                       ((int24_t *)in_stack_fffffffffffffcf8,(ostream *)in_stack_fffffffffffffcf0);
        in_stack_fffffffffffffcec = in_stack_fffffffffffffced ^ 0xff;
        sptk::int24_t::~int24_t(&local_288);
        if ((in_stack_fffffffffffffcec & 1) == 0) goto LAB_001313ce;
        local_1 = 0;
        local_d0 = 1;
      }
      else {
        local_284.value[2] = local_db[0].value[2];
        local_284.value[0] = local_db[0].value[0];
        local_284.value[1] = local_db[0].value[1];
        in_stack_fffffffffffffcef =
             sptk::SnPrintf<sptk::int24_t>
                       (in_stack_fffffffffffffd18,
                        (string *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                        CONCAT26(in_stack_fffffffffffffd0e,in_stack_fffffffffffffd08),
                        (char *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        in_stack_fffffffffffffcee = in_stack_fffffffffffffcef ^ 0xff;
        sptk::int24_t::~int24_t(&local_284);
        if ((in_stack_fffffffffffffcee & 1) == 0) {
          std::operator<<((ostream *)&std::cout,local_98);
          if ((local_9c + 1) % *(int *)(in_RDI + 0x28) == 0) {
            std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
          }
          else {
            std::operator<<((ostream *)&std::cout,"\t");
          }
LAB_001313ce:
          local_d0 = 0;
        }
        else {
          local_1 = 0;
          local_d0 = 1;
        }
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_260);
      in_stack_fffffffffffffcf8 = (ostream *)std::ostream::operator<<(local_260,local_9c);
      std::operator<<(in_stack_fffffffffffffcf8,"th data is over the range of output type");
      in_stack_fffffffffffffcf0 = &local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_280,"x2x",in_stack_fffffffffffffcf0);
      sptk::PrintErrorMessage(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      bVar5 = *(int *)(in_RDI + 0x30) == 2;
      if (bVar5) {
        local_1 = 0;
      }
      local_d0 = (uint)bVar5;
      std::__cxx11::ostringstream::~ostringstream(local_260);
      if (local_d0 == 0) goto LAB_00131224;
    }
    sptk::int24_t::~int24_t(local_db);
    if (local_d0 != 0) goto LAB_00131458;
    local_9c = local_9c + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }